

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::SetTrackerData
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *address,void *data)

{
  ushort uVar1;
  TrackerData *pTVar2;
  code *pcVar3;
  bool bVar4;
  ushort uVar5;
  undefined4 *puVar6;
  long lVar7;
  
  bVar4 = Recycler::DoProfileAllocTracker();
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x8da,"(Recycler::DoProfileAllocTracker())",
                       "Recycler::DoProfileAllocTracker()");
    if (!bVar4) goto LAB_006a46a2;
    *puVar6 = 0;
  }
  uVar5 = GetAddressIndex(this,address);
  if (uVar5 == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x8dc,"(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)",
                       "index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit");
    if (!bVar4) goto LAB_006a46a2;
    *puVar6 = 0;
  }
  uVar1 = this->objectCount;
  bVar4 = Recycler::DoProfileAllocTracker();
  lVar7 = 0;
  if (bVar4) {
    lVar7 = -(ulong)((uint)uVar1 * 8);
  }
  if (((((TrackerData *)data != &Recycler::TrackerData::ExplicitFreeListObjectData) &&
       (pTVar2 = *(TrackerData **)
                  ((long)this + (ulong)uVar5 * 8 + (lVar7 - (ulong)(uVar1 + 7 & 0xfffffff8))),
       pTVar2 != &Recycler::TrackerData::ExplicitFreeListObjectData)) && (data != (void *)0x0)) &&
     (pTVar2 != (TrackerData *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x8e0,
                       "((existingTrackerData == nullptr || data == nullptr) || (existingTrackerData == &Recycler::TrackerData::ExplicitFreeListObjectData || data == &Recycler::TrackerData::ExplicitFreeListObjectData))"
                       ,
                       "(existingTrackerData == nullptr || data == nullptr) || (existingTrackerData == &Recycler::TrackerData::ExplicitFreeListObjectData || data == &Recycler::TrackerData::ExplicitFreeListObjectData)"
                      );
    if (!bVar4) {
LAB_006a46a2:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  uVar1 = this->objectCount;
  bVar4 = Recycler::DoProfileAllocTracker();
  lVar7 = 0;
  if (bVar4) {
    lVar7 = (ulong)uVar1 * -8;
  }
  *(void **)((long)this + (ulong)uVar5 * 8 + (lVar7 - (ulong)(uVar1 + 7 & 0xfffffff8))) = data;
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::SetTrackerData(void * address, void * data)
{
    Assert(Recycler::DoProfileAllocTracker());
    ushort index = this->GetAddressIndex(address);
    Assert(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);

    void* existingTrackerData = this->GetTrackerDataArray()[index];
    Assert((existingTrackerData == nullptr || data == nullptr) ||
        (existingTrackerData == &Recycler::TrackerData::ExplicitFreeListObjectData || data == &Recycler::TrackerData::ExplicitFreeListObjectData));
    this->GetTrackerDataArray()[index] = data;
}